

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O3

pin_container_t * __thiscall
lsim::SimComponent::output_pins(pin_container_t *__return_storage_ptr__,SimComponent *this)

{
  pointer puVar1;
  allocator_type local_9;
  
  puVar1 = (this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(puVar1 + this->m_output_start),
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(puVar1 + this->m_control_start),&local_9);
  return __return_storage_ptr__;
}

Assistant:

pin_container_t SimComponent::output_pins() const {
	return pin_container_t(m_pins.begin() + m_output_start, m_pins.begin() + m_control_start);
}